

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

void __thiscall
Js::JavascriptRegExp::ExtractSnapObjectDataInto
          (JavascriptRegExp *this,SnapObject *objData,SlabAllocator *alloc)

{
  RegexFlags RVar1;
  TTString *into;
  byte local_5c;
  Type local_58;
  uint32 local_50;
  undefined8 local_40;
  undefined8 local_38;
  
  local_40 = objData;
  local_38 = alloc;
  into = (TTString *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
  UnifiedRegex::RegexPattern::GetSource((RegexPattern *)&stack0xffffffffffffffa0);
  UnifiedRegex::RegexPattern::GetSource((RegexPattern *)&local_50);
  TTD::SlabAllocatorBase<0>::CopyStringIntoWLength
            ((SlabAllocatorBase<0> *)local_38,
             (char16 *)
             ((long)&((local_58.ptr)->resultBV).data[0].word + (ulong)((uint)local_5c * 2)),local_50
             ,into);
  RVar1 = UnifiedRegex::RegexPattern::GetFlags((this->pattern).ptr);
  *(RegexFlags *)&into[1].Length = RVar1;
  into[1].Contents = (char16 *)(this->lastIndexVar).ptr;
  *(Type *)&into[1].field_0x4 = this->lastIndexOrFlag;
  if (*(SnapObjectType *)(local_40 + 8) == SnapRegexObject) {
    *(TTString **)(local_40 + 0x40) = into;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void JavascriptRegExp::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapRegexInfo* sri = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapRegexInfo>();

        UnifiedRegex::RegexPattern* pattern = this->pattern;
        alloc.CopyStringIntoWLength(pattern->GetSource().GetBuffer(), pattern->GetSource().GetLength(), sri->RegexStr);
        //split regex should be automatically generated from regex string and flags so no need to exttract it as well

        sri->Flags = this->GetFlags();
        sri->LastIndexVar = TTD_CONVERT_JSVAR_TO_TTDVAR(this->lastIndexVar);
        sri->LastIndexOrFlag = this->lastIndexOrFlag;

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapRegexInfo*, TTD::NSSnapObjects::SnapObjectType::SnapRegexObject>(objData, sri);
    }